

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blur.h
# Opt level: O3

void __thiscall BlurExample::initialize(BlurExample *this)

{
  int *this_00;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  **ppvVar1;
  byte bVar2;
  Texture *pTVar3;
  RootWindow *pRVar4;
  mat4 o;
  element_type *this_01;
  Texture *pTVar5;
  Node *this_02;
  uint *puVar6;
  TransformNode *this_03;
  Node *pNVar7;
  TextureNode *child;
  long lVar8;
  float *pfVar9;
  undefined8 *puVar10;
  float *pfVar11;
  byte bVar12;
  float extraout_XMM0_Da;
  float fVar13;
  float extraout_XMM0_Db;
  rect2d rect;
  vec4 color;
  rect2d rect_00;
  vec4 color_00;
  rect2d rect_01;
  rect2d rect_02;
  vec4 color_01;
  rect2d rect_03;
  vec4 color_02;
  rect2d rect_04;
  vec4 color_03;
  rect2d rect_05;
  float in_stack_fffffffffffffe68 [16];
  float local_148 [6];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_120;
  undefined8 local_11c;
  undefined8 uStack_114;
  undefined8 local_10c;
  undefined1 local_104 [8];
  mat4 matrix;
  shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>_>
  a;
  
  bVar12 = 0;
  pTVar5 = ImageUtils::load((((this->super_Example).m_window)->super_StandardSurface).m_renderer.
                            _M_t.
                            super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>
                            .super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl,
                            "walker.png");
  pTVar3 = (this->m_texture)._M_t.
           super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>._M_t.
           super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>.
           super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl;
  (this->m_texture)._M_t.
  super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>._M_t.
  super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>.
  super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl = pTVar5;
  if (pTVar3 != (Texture *)0x0) {
    (*pTVar3->_vptr_Texture[1])();
  }
  (*((((this->super_Example).m_window)->super_StandardSurface).super_Surface.m_impl)->
    _vptr_SurfaceBackendImpl[6])();
  this_02 = &rengine::BlurNode::create()->super_Node;
  *(undefined4 *)&this_02->field_0x34 = 0x25;
  a.
  super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(0x58);
  ((a.
    super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_AbstractAnimation).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x100000001;
  ((a.
    super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_AbstractAnimation).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00145a10;
  this_00 = &((a.
               super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_AbstractAnimation).m_iterations;
  ((a.
    super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_AbstractAnimation).m_duration = 0.0;
  bVar2 = *(byte *)&((a.
                      super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->m_keyFrames).
                    super__Vector_base<rengine::KeyFrame<unsigned_int>,_std::allocator<rengine::KeyFrame<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  *(undefined ***)
   &((a.
      super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_AbstractAnimation).m_iterations = &PTR__Animation_00145a60;
  ((a.
    super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->m_keyFrames).
  super__Vector_base<rengine::KeyFrame<unsigned_int>,_std::allocator<rengine::KeyFrame<unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_02;
  ((a.
    super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->m_keyFrames).
  super__Vector_base<rengine::KeyFrame<unsigned_int>,_std::allocator<rengine::KeyFrame<unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  a.
  super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr[1].super_AbstractAnimation.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  a.
  super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr[1].super_AbstractAnimation.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (a.
   super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr)->m_target = (BlurNode *)0x4000000000000000;
  *(byte *)&((a.
              super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->m_keyFrames).
            super__Vector_base<rengine::KeyFrame<unsigned_int>,_std::allocator<rengine::KeyFrame<unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start = bVar2 & 0xf8 | 4;
  *(undefined4 *)
   &((a.
      super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_AbstractAnimation).field_0x20 = 0xffffffff;
  puVar6 = rengine::
           Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame((Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>
                          *)this_00,0.0);
  *puVar6 = 0;
  puVar6 = rengine::
           Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame((Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>
                          *)this_00,1.0);
  this_01 = a.
            super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  *puVar6 = 100;
  pRVar4 = (this->super_Example).m_window;
  if (a.
      super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ppvVar1 = &((a.
                   super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_AbstractAnimation).super_SignalEmitter.m_buckets;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
      UNLOCK();
    }
    else {
      ppvVar1 = &((a.
                   super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_AbstractAnimation).super_SignalEmitter.m_buckets;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  matrix._60_8_ = this_00;
  rengine::AnimationManager::start
            (&(pRVar4->super_StandardSurface).m_animationManager,
             (shared_ptr<rengine::AbstractAnimation> *)(matrix.m + 0xf),0.0);
  fVar13 = extraout_XMM0_Db * 0.5;
  if (extraout_XMM0_Da * 0.5 <= extraout_XMM0_Db * 0.5) {
    fVar13 = extraout_XMM0_Da * 0.5;
  }
  if (this_01 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  (this->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_animation).
              super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&a);
  matrix.m[0xf] = 1.0;
  matrix.type = 0;
  local_148[0] = fVar13;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  local_148[3] = 0.0;
  local_148[4] = 0.0;
  local_148[5] = fVar13;
  local_130 = 0;
  uStack_128 = 0;
  local_120 = 0x3f800000;
  local_11c = 0;
  uStack_114 = 0;
  local_10c = 0x23f800000;
  pfVar9 = local_148;
  puVar10 = (undefined8 *)&stack0xfffffffffffffe68;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *(undefined8 *)pfVar9;
    pfVar9 = pfVar9 + ((ulong)bVar12 * -2 + 1) * 2;
    puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
  }
  o.type = local_10c._4_4_;
  o.m[0] = in_stack_fffffffffffffe68[0];
  o.m[1] = in_stack_fffffffffffffe68[1];
  o.m[2] = in_stack_fffffffffffffe68[2];
  o.m[3] = in_stack_fffffffffffffe68[3];
  o.m[4] = in_stack_fffffffffffffe68[4];
  o.m[5] = in_stack_fffffffffffffe68[5];
  o.m[6] = in_stack_fffffffffffffe68[6];
  o.m[7] = in_stack_fffffffffffffe68[7];
  o.m[8] = in_stack_fffffffffffffe68[8];
  o.m[9] = in_stack_fffffffffffffe68[9];
  o.m[10] = in_stack_fffffffffffffe68[10];
  o.m[0xb] = in_stack_fffffffffffffe68[0xb];
  o.m[0xc] = in_stack_fffffffffffffe68[0xc];
  o.m[0xd] = in_stack_fffffffffffffe68[0xd];
  o.m[0xe] = in_stack_fffffffffffffe68[0xe];
  o.m[0xf] = in_stack_fffffffffffffe68[0xf];
  rengine::mat4::operator*((mat4 *)local_104,(mat4 *)(matrix.m + 0xf),o);
  pfVar9 = (float *)local_104;
  pfVar11 = matrix.m + 0xf;
  for (lVar8 = 0x11; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pfVar11 = *pfVar9;
    pfVar9 = pfVar9 + (ulong)bVar12 * -2 + 1;
    pfVar11 = pfVar11 + (ulong)bVar12 * -2 + 1;
  }
  this_03 = rengine::TransformNode::create();
  pfVar9 = matrix.m + 0xf;
  pfVar11 = (float *)&(this_03->super_Node).field_0x34;
  for (lVar8 = 0x11; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pfVar11 = *pfVar9;
    pfVar9 = pfVar9 + (ulong)bVar12 * -2 + 1;
    pfVar11 = pfVar11 + (ulong)bVar12 * -2 + 1;
  }
  this_03->m_projectionDepth = 0.0;
  pNVar7 = (Node *)rengine::RectangleNode::create();
  rect.br.x = 0.45000002;
  rect.br.y = -0.19999999;
  rect.tl.x = 0.15;
  rect.tl.y = -0.5;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar7,rect);
  color.z = 0.0;
  color.w = 1.0;
  color.x = 1.0;
  color.y = 0.0;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar7,color);
  rengine::Node::append(this_02,pNVar7);
  pNVar7 = (Node *)rengine::RectangleNode::create();
  rect_00.br.x = 0.45000002;
  rect_00.br.y = 0.15;
  rect_00.tl.x = 0.15;
  rect_00.tl.y = -0.15;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar7,rect_00);
  color_00.z = 0.0;
  color_00.w = 1.0;
  color_00.x = 0.0;
  color_00.y = 1.0;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar7,color_00);
  rengine::Node::append(this_02,pNVar7);
  pNVar7 = (Node *)rengine::RectangleNode::create();
  rect_01.br.x = 0.45000002;
  rect_01.br.y = 0.5;
  rect_01.tl.x = 0.15;
  rect_01.tl.y = 0.2;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar7,rect_01);
  rengine::RectangleNode::setColor
            ((RectangleNode *)pNVar7,(vec4)(ZEXT816(0x3f8000003f800000) << 0x40));
  rengine::Node::append(this_02,pNVar7);
  pNVar7 = (Node *)rengine::RectangleNode::create();
  rect_02.br.x = 0.8;
  rect_02.br.y = -0.19999999;
  rect_02.tl.x = 0.5;
  rect_02.tl.y = -0.5;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar7,rect_02);
  color_01.z = 0.0;
  color_01.w = 1.0;
  color_01.x = 1.0;
  color_01.y = 1.0;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar7,color_01);
  rengine::Node::append(this_02,pNVar7);
  pNVar7 = (Node *)rengine::RectangleNode::create();
  rect_03.br.x = 0.8;
  rect_03.br.y = 0.15;
  rect_03.tl.x = 0.5;
  rect_03.tl.y = -0.15;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar7,rect_03);
  color_02.z = 1.0;
  color_02.w = 1.0;
  color_02.x = 0.0;
  color_02.y = 1.0;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar7,color_02);
  rengine::Node::append(this_02,pNVar7);
  pNVar7 = (Node *)rengine::RectangleNode::create();
  rect_04.br.x = 0.8;
  rect_04.br.y = 0.5;
  rect_04.tl.x = 0.5;
  rect_04.tl.y = 0.2;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar7,rect_04);
  color_03.z = 1.0;
  color_03.w = 1.0;
  color_03.x = 1.0;
  color_03.y = 0.0;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar7,color_03);
  rengine::Node::append(this_02,pNVar7);
  pTVar3 = (this->m_texture)._M_t.
           super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>._M_t.
           super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>.
           super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl;
  child = rengine::TextureNode::create();
  rect_05.br.x = -0.15000004;
  rect_05.br.y = 0.5;
  rect_05.tl.x = -0.8;
  rect_05.tl.y = -0.5;
  rengine::RectangleNodeBase::setGeometry(&child->super_RectangleNodeBase,rect_05);
  child->m_texture = pTVar3;
  rengine::Node::append(this_02,(Node *)child);
  rengine::Node::append(&this_03->super_Node,this_02);
  rengine::Node::append((Node *)this,&this_03->super_Node);
  if (a.
      super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               a.
               super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  return;
}

Assistant:

void initialize() override {
        m_texture.reset(ImageUtils::load(renderer(), "walker.png"));

        vec2 s = size();
        float w2 = s.x / 2.0f;
        float h2 = s.y / 2.0f;
        float s2 = std::min(w2, h2);

        BlurNode *blurNode = BlurNode::create(37);

        auto a = make_shared<Animation_BlurNode_radius>(blurNode);
        a->setDuration(2);
        a->setDirection(AbstractAnimation::Alternate);
        a->setIterations(-1);
        a->newKeyFrame(0) = 0;
        a->newKeyFrame(1) = 100;

        animationManager()->start(a);
        m_animation = a;

        mat4 matrix = mat4::translate2D(w2, h2)
                      * mat4::scale2D(s2, s2);
        Node *root = &(*TransformNode::create(matrix)
                    << &(*blurNode
                       << RectangleNode::create(rect2d::fromXywh(0.15, -0.5,  0.3, 0.3), vec4(1, 0, 0, 1))
                       << RectangleNode::create(rect2d::fromXywh(0.15, -0.15, 0.3, 0.3), vec4(0, 1, 0, 1))
                       << RectangleNode::create(rect2d::fromXywh(0.15,  0.2,  0.3, 0.3), vec4(0, 0, 1, 1))
                       << RectangleNode::create(rect2d::fromXywh( 0.5, -0.5,  0.3, 0.3), vec4(1, 1, 0, 1))
                       << RectangleNode::create(rect2d::fromXywh( 0.5, -0.15, 0.3, 0.3), vec4(0, 1, 1, 1))
                       << RectangleNode::create(rect2d::fromXywh( 0.5,  0.2,  0.3, 0.3), vec4(1, 0, 1, 1))
                       << TextureNode::create(rect2d::fromXywh(-0.8, -0.5, 0.65, 1.0), m_texture.get())
                     )
                );
        append(root);
    }